

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type * __thiscall
FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>,_Fad<long_double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>_>
::fastAccessDx(value_type *__return_storage_ptr__,
              FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>,_Fad<long_double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>_>
              *this,int i)

{
  FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>,_Fad<long_double>_>_>_>
  ::fastAccessDx(*(value_type **)__return_storage_ptr__,
                 (FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>,_Fad<long_double>_>_>_>
                  *)this,i);
  return *(value_type **)(*(long *)(*(long *)((long)__return_storage_ptr__ + 8) + 8) + 0x18);
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i)+right_.fastAccessDx(i);}